

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O2

ActionMessage * __thiscall
helics::BaseTimeCoordinator::generateTimeRequest
          (ActionMessage *__return_storage_ptr__,BaseTimeCoordinator *this,TimeData *dep,
          GlobalFederateId fed,int32_t responseCode)

{
  byte *pbVar1;
  long lVar2;
  long lVar3;
  action_t newAction;
  
  ActionMessage::ActionMessage(__return_storage_ptr__,cmd_time_request);
  (__return_storage_ptr__->source_id).gid = (this->mSourceId).gid;
  (__return_storage_ptr__->dest_id).gid = fed.gid;
  (__return_storage_ptr__->actionTime).internalTimeCode = (dep->next).internalTimeCode;
  if (dep->interrupted == true) {
    pbVar1 = (byte *)((long)&__return_storage_ptr__->flags + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  switch(dep->mTimeState) {
  case initialized:
    if (dep->responseSequenceCounter == 0) goto switchD_002d5c23_caseD_a;
    ActionMessage::setAction(__return_storage_ptr__,cmd_exec_grant);
    (__return_storage_ptr__->dest_handle).hid = (dep->minFed).gid;
    setIterationFlags(__return_storage_ptr__,ITERATE_IF_NEEDED);
    break;
  case exec_requested_require_iteration:
    ActionMessage::setAction(__return_storage_ptr__,cmd_exec_request);
    setIterationFlags(__return_storage_ptr__,FORCE_ITERATION);
    goto LAB_002d5cd8;
  case exec_requested_iterative:
    ActionMessage::setAction(__return_storage_ptr__,cmd_exec_request);
    setIterationFlags(__return_storage_ptr__,ITERATE_IF_NEEDED);
LAB_002d5cd8:
    (__return_storage_ptr__->dest_handle).hid = (dep->minFed).gid;
    break;
  case exec_requested:
    ActionMessage::setAction(__return_storage_ptr__,cmd_exec_request);
    (__return_storage_ptr__->actionTime).internalTimeCode = 0;
    break;
  default:
    goto switchD_002d5c23_caseD_4;
  case time_granted:
    newAction = cmd_time_grant;
    goto LAB_002d5c6d;
  case time_requested_require_iteration:
    (__return_storage_ptr__->dest_handle).hid = (dep->minFed).gid;
    setIterationFlags(__return_storage_ptr__,FORCE_ITERATION);
    lVar2 = (dep->Te).internalTimeCode;
    lVar3 = (dep->minDe).internalTimeCode;
    if (lVar2 < lVar3) {
      lVar3 = lVar2;
    }
    (__return_storage_ptr__->Tdemin).internalTimeCode = lVar3;
    __return_storage_ptr__->counter = (uint16_t)this->sequenceCounter;
    (__return_storage_ptr__->Te).internalTimeCode = lVar2;
    goto LAB_002d5d1a;
  case time_requested_iterative:
    (__return_storage_ptr__->dest_handle).hid = (dep->minFed).gid;
    setIterationFlags(__return_storage_ptr__,ITERATE_IF_NEEDED);
    goto LAB_002d5cfa;
  case time_requested:
    (__return_storage_ptr__->dest_handle).hid = (dep->minFed).gid;
LAB_002d5cfa:
    lVar2 = (dep->Te).internalTimeCode;
    lVar3 = (dep->minDe).internalTimeCode;
    if (lVar2 < lVar3) {
      lVar3 = lVar2;
    }
    (__return_storage_ptr__->Tdemin).internalTimeCode = lVar3;
    (__return_storage_ptr__->Te).internalTimeCode = lVar2;
    break;
  case error:
switchD_002d5c23_caseD_a:
    newAction = cmd_ignore;
LAB_002d5c6d:
    ActionMessage::setAction(__return_storage_ptr__,newAction);
    goto switchD_002d5c23_caseD_4;
  }
  __return_storage_ptr__->counter = (uint16_t)this->sequenceCounter;
LAB_002d5d1a:
  (__return_storage_ptr__->source_handle).hid = responseCode;
switchD_002d5c23_caseD_4:
  return __return_storage_ptr__;
}

Assistant:

ActionMessage BaseTimeCoordinator::generateTimeRequest(const TimeData& dep,
                                                       GlobalFederateId fed,
                                                       std::int32_t responseCode) const
{
    ActionMessage nTime(CMD_TIME_REQUEST);
    nTime.source_id = mSourceId;
    nTime.dest_id = fed;
    nTime.actionTime = dep.next;
    if (dep.interrupted) {
        setActionFlag(nTime, interrupted_flag);
    }
    switch (dep.mTimeState) {
        case TimeState::time_granted:
            nTime.setAction(CMD_TIME_GRANT);
            break;
        case TimeState::time_requested:
            nTime.setExtraData(dep.minFed.baseValue());
            nTime.Tdemin = std::min(dep.minDe, dep.Te);
            nTime.Te = dep.Te;
            nTime.counter = sequenceCounter;
            nTime.setExtraDestData(responseCode);
            break;
        case TimeState::time_requested_iterative:
            nTime.setExtraData(dep.minFed.baseValue());
            setIterationFlags(nTime, IterationRequest::ITERATE_IF_NEEDED);
            nTime.Tdemin = std::min(dep.minDe, dep.Te);
            nTime.Te = dep.Te;
            nTime.counter = sequenceCounter;
            nTime.setExtraDestData(responseCode);
            break;
        case TimeState::time_requested_require_iteration:
            nTime.setExtraData(dep.minFed.baseValue());
            setIterationFlags(nTime, IterationRequest::FORCE_ITERATION);
            nTime.Tdemin = std::min(dep.minDe, dep.Te);
            nTime.counter = sequenceCounter;
            nTime.Te = dep.Te;
            nTime.setExtraDestData(responseCode);
            break;
        case TimeState::exec_requested:
            nTime.setAction(CMD_EXEC_REQUEST);
            nTime.actionTime = Time::zeroVal();
            nTime.counter = sequenceCounter;
            nTime.setExtraDestData(responseCode);
            break;
        case TimeState::error:
            nTime.setAction(CMD_IGNORE);
            // no need to send updates for this
            break;
        case TimeState::exec_requested_iterative:
            nTime.setAction(CMD_EXEC_REQUEST);
            setIterationFlags(nTime, IterationRequest::ITERATE_IF_NEEDED);
            nTime.setExtraData(dep.minFed.baseValue());
            nTime.counter = sequenceCounter;
            nTime.setExtraDestData(responseCode);
            break;
        case TimeState::exec_requested_require_iteration:
            nTime.setAction(CMD_EXEC_REQUEST);
            setIterationFlags(nTime, IterationRequest::FORCE_ITERATION);
            nTime.setExtraData(dep.minFed.baseValue());
            nTime.counter = sequenceCounter;
            nTime.setExtraDestData(responseCode);
            break;
        case TimeState::initialized:
            if (dep.responseSequenceCounter == 0) {
                nTime.setAction(CMD_IGNORE);
            } else {
                nTime.setAction(CMD_EXEC_GRANT);
                nTime.setExtraData(dep.minFed.baseValue());
                setIterationFlags(nTime, IterationRequest::ITERATE_IF_NEEDED);
                nTime.counter = sequenceCounter;
                nTime.setExtraDestData(responseCode);
            }

            break;
    }

    return nTime;
}